

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O0

void __thiscall
utf8_valid_3_bytes_ed_Test::~utf8_valid_3_bytes_ed_Test(utf8_valid_3_bytes_ed_Test *this)

{
  utf8_valid_3_bytes_ed_Test *this_local;
  
  ~utf8_valid_3_bytes_ed_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(utf8, valid_3_bytes_ed) {
  int cu0 = 0xed;
  FOR_EACH_BYTE(cu1) {
    FOR_EACH_BYTE(cu2) {
      bool is_valid =
          is_in_range(cu1, 0x80, 0xa0) && is_in_range(cu2, 0x80, 0xc0);
      assert_is_valid_utf8(is_valid, 3, cu0, cu1, cu2);
    }
  }
}